

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

void ImGuiStb::stb_textedit_discard_redo(StbUndoState *state)

{
  int iVar1;
  long lVar2;
  long in_RDI;
  int i;
  int n;
  int k;
  undefined4 local_14;
  
  if (*(short *)(in_RDI + 0xe00) < 99) {
    if (-1 < *(int *)(in_RDI + 0x62c)) {
      iVar1 = *(int *)(in_RDI + 0x624);
      *(int *)(in_RDI + 0xe08) = iVar1 + *(int *)(in_RDI + 0xe08);
      memmove((void *)(in_RDI + 0x630 + (long)*(int *)(in_RDI + 0xe08) * 2),
              (void *)(in_RDI + 0x630 + (long)*(int *)(in_RDI + 0xe08) * 2 + (long)iVar1 * -2),
              (long)(999 - *(int *)(in_RDI + 0xe08)) << 1);
      for (local_14 = (int)*(short *)(in_RDI + 0xe00); local_14 < 0x62; local_14 = local_14 + 1) {
        if (-1 < *(int *)(in_RDI + (long)local_14 * 0x10 + 0xc)) {
          lVar2 = in_RDI + (long)local_14 * 0x10;
          *(int *)(lVar2 + 0xc) = iVar1 + *(int *)(lVar2 + 0xc);
        }
      }
    }
    memmove((void *)(in_RDI + (long)(int)*(short *)(in_RDI + 0xe00) * 0x10 + 0x10),
            (void *)(in_RDI + (long)(int)*(short *)(in_RDI + 0xe00) * 0x10),
            (long)(99 - *(short *)(in_RDI + 0xe00)) << 4);
    *(short *)(in_RDI + 0xe00) = *(short *)(in_RDI + 0xe00) + 1;
  }
  return;
}

Assistant:

static void stb_textedit_discard_redo(StbUndoState *state)
{
   int k = STB_TEXTEDIT_UNDOSTATECOUNT-1;

   if (state->redo_point <= k) {
      // if the k'th undo state has characters, clean those up
      if (state->undo_rec[k].char_storage >= 0) {
         int n = state->undo_rec[k].insert_length, i;
         // move the remaining redo character data to the end of the buffer
         state->redo_char_point += n;
         STB_TEXTEDIT_memmove(state->undo_char + state->redo_char_point, state->undo_char + state->redo_char_point-n, (size_t) ((STB_TEXTEDIT_UNDOCHARCOUNT - state->redo_char_point)*sizeof(STB_TEXTEDIT_CHARTYPE)));
         // adjust the position of all the other records to account for above memmove
         for (i=state->redo_point; i < k; ++i)
            if (state->undo_rec[i].char_storage >= 0)
               state->undo_rec[i].char_storage += n;
      }
      // now move all the redo records towards the end of the buffer; the first one is at 'redo_point'
      STB_TEXTEDIT_memmove(state->undo_rec + state->redo_point+1, state->undo_rec + state->redo_point, (size_t) ((STB_TEXTEDIT_UNDOSTATECOUNT - state->redo_point)*sizeof(state->undo_rec[0])));
      // now move redo_point to point to the new one
      ++state->redo_point;
   }
}